

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JITTimeProfileInfo.cpp
# Opt level: O2

ValueType __thiscall
JITTimeProfileInfo::GetReturnType(JITTimeProfileInfo *this,OpCode opcode,ProfileId callSiteId)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  anon_union_2_4_ea848c7b_for_ValueType_13 *paVar4;
  
  if ((ushort)(opcode - Concat3) < 0xfffc) {
    bVar2 = Js::DynamicProfileInfo::IsProfiledCallOp(opcode);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeProfileInfo.cpp"
                         ,0xf7,"(Js::DynamicProfileInfo::IsProfiledCallOp(opcode))",
                         "Js::DynamicProfileInfo::IsProfiledCallOp(opcode)");
      if (!bVar2) goto LAB_0051f1cc;
      *puVar3 = 0;
    }
    if ((this->m_profileData).profiledCallSiteCount <= callSiteId) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeProfileInfo.cpp"
                         ,0xf8,"(callSiteId < GetProfiledCallSiteCount())",
                         "callSiteId < GetProfiledCallSiteCount()");
      if (!bVar2) {
LAB_0051f1cc:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    paVar4 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
             ((this->m_profileData).callSiteData + callSiteId);
  }
  else {
    bVar2 = Js::DynamicProfileInfo::IsProfiledReturnTypeOp(opcode);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeProfileInfo.cpp"
                         ,0xfb,"(Js::DynamicProfileInfo::IsProfiledReturnTypeOp(opcode))",
                         "Js::DynamicProfileInfo::IsProfiledReturnTypeOp(opcode)");
      if (!bVar2) goto LAB_0051f1cc;
      *puVar3 = 0;
    }
    if ((this->m_profileData).profiledReturnTypeCount <= callSiteId) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/JITTimeProfileInfo.cpp"
                         ,0xfc,"(callSiteId < GetProfiledReturnTypeCount())",
                         "callSiteId < GetProfiledReturnTypeCount()");
      if (!bVar2) goto LAB_0051f1cc;
      *puVar3 = 0;
    }
    paVar4 = (anon_union_2_4_ea848c7b_for_ValueType_13 *)
             ((ulong)((uint)callSiteId * 2) + (long)(this->m_profileData).returnTypeData);
  }
  return (anon_union_2_4_ea848c7b_for_ValueType_13)
         (anon_union_2_4_ea848c7b_for_ValueType_13)
         *(anon_union_2_4_ea848c7b_for_ValueType_13 *)&paVar4->field_0;
}

Assistant:

ValueType
JITTimeProfileInfo::GetReturnType(Js::OpCode opcode, Js::ProfileId callSiteId) const
{
    if (opcode < Js::OpCode::ProfiledReturnTypeCallI || (opcode > Js::OpCode::ProfiledReturnTypeCallIFlags && opcode < Js::OpCode::ProfiledReturnTypeCallIExtended) || opcode > Js::OpCode::ProfiledReturnTypeCallIExtendedFlags)
    {
        Assert(Js::DynamicProfileInfo::IsProfiledCallOp(opcode));
        AssertOrFailFast(callSiteId < GetProfiledCallSiteCount());
        return GetCallSiteInfo()[callSiteId].returnType;
    }
    Assert(Js::DynamicProfileInfo::IsProfiledReturnTypeOp(opcode));
    AssertOrFailFast(callSiteId < GetProfiledReturnTypeCount());
    return reinterpret_cast<ValueType*>(m_profileData.returnTypeData)[callSiteId];
}